

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool cs::compiler_type::find_id_ref(iterator it,string *id)

{
  token_base *ptVar1;
  size_t __n;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  token_base **pptVar5;
  iterator iVar6;
  tree_type<cs::token_base_*> *tree;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  size_t sVar9;
  iterator local_30;
  
  if (it.mData != (tree_node *)0x0) {
    local_30.mData = it.mData;
    pptVar5 = tree_type<cs::token_base_*>::iterator::data(&local_30);
    ptVar1 = *pptVar5;
    if (ptVar1 != (token_base *)0x0) {
      iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1);
      if (iVar4 != 0xe) {
        if (iVar4 == 0xc) {
          pptVar5 = tree_type<cs::token_base_*>::iterator::data(&local_30);
          iVar6.mData = (tree_node *)(*pptVar5)[1]._vptr_token_base;
        }
        else {
          if (iVar4 == 4) {
            __n = ptVar1[3].line_num;
            if (__n != id->_M_string_length) {
              return false;
            }
            if (__n == 0) {
              return true;
            }
            iVar4 = bcmp(ptVar1[3]._vptr_token_base,(id->_M_dataplus)._M_p,__n);
            return iVar4 == 0;
          }
          iVar6 = tree_type<cs::token_base_*>::iterator::left(&local_30);
          bVar3 = find_id_ref(iVar6,id);
          if (bVar3) {
            return true;
          }
          iVar6 = tree_type<cs::token_base_*>::iterator::right(&local_30);
        }
        bVar3 = find_id_ref(iVar6,id);
        return bVar3;
      }
      pp_Var7 = ptVar1[2]._vptr_token_base;
      pp_Var2 = ptVar1[4]._vptr_token_base;
      if (pp_Var7 != pp_Var2) {
        pp_Var8 = ptVar1[3]._vptr_token_base;
        sVar9 = ptVar1[3].line_num;
        do {
          bVar3 = find_id_ref((tree_node *)*pp_Var7,id);
          if (bVar3) {
            return bVar3;
          }
          pp_Var7 = pp_Var7 + 1;
          if (pp_Var7 == pp_Var8) {
            pp_Var7 = *(_func_int ***)(sVar9 + 8);
            sVar9 = sVar9 + 8;
            pp_Var8 = pp_Var7 + 0x40;
          }
        } while (pp_Var7 != pp_Var2);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool compiler_type::find_id_ref(tree_type<token_base *>::iterator it, const std::string &id)
	{
		if (!it.usable())
			return false;
		token_base *token = it.data();
		if (token == nullptr)
			return false;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id:
			return static_cast<token_id *>(token)->get_id().get_id() == id;
		case token_types::expr:
			return find_id_ref(static_cast<token_expr *>(it.data())->get_tree().root(), id);
		case token_types::array: {
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				if (find_id_ref(tree.root(), id))
					return true;
			}
			return false;
		}
		}
		if (find_id_ref(it.left(), id) || find_id_ref(it.right(), id))
			return true;
		else
			return false;
	}